

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_CfdParseScriptTest_LockingScript_Test_Test::
~cfdcapi_script_CfdParseScriptTest_LockingScript_Test_Test
          (cfdcapi_script_CfdParseScriptTest_LockingScript_Test_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_script_CfdParseScriptTest_LockingScript_Test_Test
            ((cfdcapi_script_CfdParseScriptTest_LockingScript_Test_Test *)0x3b5c48);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(cfdcapi_script, CfdParseScriptTest_LockingScript_Test) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  // OP_DUP OP_HASH160 <HASH160(038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301)> OP_EQUALVERIFY OP_CHECKSIG
  const char* locking_script = "76a9142e3f2c7e30abce5b22451184c5e531a1e23c6e1288ac";
  void* item_handle = nullptr;
  uint32_t item_num = 0;;

  ret = CfdParseScript(handle, locking_script, &item_handle, &item_num);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == item_handle));
  EXPECT_EQ(5, item_num);

  if (ret == kCfdSuccess) {
    std::vector<std::string> script_items;
    script_items.reserve(item_num);
    for (uint32_t i = 0; i < item_num; ++i) {
      char* pitem = nullptr;
      ret = CfdGetScriptItem(handle, item_handle, i, &pitem);
      EXPECT_EQ(kCfdSuccess, ret);
      std::string item(pitem);
      CfdFreeStringBuffer(pitem);
      if (ret == kCfdSuccess) {
        script_items.push_back(item);
      }
    }

    if (script_items.size() == 5) {
      EXPECT_STREQ(script_items.at(0).c_str(), "OP_DUP");
      EXPECT_STREQ(script_items.at(1).c_str(), "OP_HASH160");
      EXPECT_STREQ(script_items.at(2).c_str(), "2e3f2c7e30abce5b22451184c5e531a1e23c6e12");
      EXPECT_STREQ(script_items.at(3).c_str(), "OP_EQUALVERIFY");
      EXPECT_STREQ(script_items.at(4).c_str(), "OP_CHECKSIG");
    }
  }
  ret = CfdFreeScriptItemHandle(handle, item_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}